

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O0

int __thiscall CRNTOCommand::doWhat(CRNTOCommand *this,CClient *pClient)

{
  EFTPSTATE EVar1;
  int iVar2;
  char *pcVar3;
  char *__new;
  allocator local_109;
  undefined1 local_108 [8];
  string ret_3;
  undefined1 local_e0 [8];
  string ret_2;
  undefined1 local_b8 [8];
  string ret_1;
  allocator local_81;
  undefined1 local_80 [8];
  string ret;
  string local_40;
  CClient *local_20;
  CClient *pClient_local;
  CRNTOCommand *this_local;
  
  local_20 = pClient;
  pClient_local = (CClient *)this;
  EVar1 = CClient::GetClientState(pClient);
  if ((int)EVar1 < 4) {
    EVar1 = CClient::GetClientState(local_20);
    if ((int)EVar1 < 3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_108,"530 Please login with USER and PASS.\r\n",&local_109);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      CClient::sendMsg(local_20,(string *)local_108);
      this_local._4_4_ = -1;
      std::__cxx11::string::~string((string *)local_108);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_e0,"503 RNFR required first.\r\n",
                 (allocator *)(ret_3.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(ret_3.field_2._M_local_buf + 0xf));
      CClient::sendMsg(local_20,(string *)local_e0);
      this_local._4_4_ = -1;
      std::__cxx11::string::~string((string *)local_e0);
    }
  }
  else {
    CClient::GetUserDir_abi_cxx11_(&local_40,local_20);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    chdir(pcVar3);
    std::__cxx11::string::~string((string *)&local_40);
    CClient::GetClientLastFileName_abi_cxx11_((string *)((long)&ret.field_2 + 8),local_20);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    __new = (char *)std::__cxx11::string::c_str();
    iVar2 = rename(pcVar3,__new);
    std::__cxx11::string::~string((string *)(ret.field_2._M_local_buf + 8));
    if (iVar2 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_80,"250 Rename successful.\r\n",&local_81);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      CClient::sendMsg(local_20,(string *)local_80);
      CClient::SetClientState(local_20,PASS);
      this_local._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_80);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_b8,"550 Rename failed.\r\n",
                 (allocator *)(ret_2.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(ret_2.field_2._M_local_buf + 0xf));
      CClient::sendMsg(local_20,(string *)local_b8);
      CClient::SetClientState(local_20,PASS);
      this_local._4_4_ = -1;
      std::__cxx11::string::~string((string *)local_b8);
    }
  }
  return this_local._4_4_;
}

Assistant:

int CRNTOCommand::doWhat(CClient *pClient) {
    if(pClient->GetClientState() >= RNFR) {
        chdir(pClient->GetUserDir().c_str());
        if(0 == rename(pClient->GetClientLastFileName().c_str(),m_Args.c_str())){
            string ret = "250 Rename successful.\r\n";
            pClient->sendMsg(ret);
            pClient->SetClientState(PASS);
            return 1;
        }
        else{
            string ret = "550 Rename failed.\r\n";
            pClient->sendMsg(ret);
            pClient->SetClientState(PASS);
            return -1;
        }
    }
    else if(pClient->GetClientState() >= PASS){
        string ret = "503 RNFR required first.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
    else{
        string ret = "530 Please login with USER and PASS.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}